

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall vm::VM::CALL(VM *this,u2 index)

{
  vector<vm::VM::Context,_std::allocator<vm::VM::Context>_> *this_00;
  ushort uVar1;
  pointer pCVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  undefined8 *puVar6;
  uint uVar7;
  undefined6 in_register_00000032;
  ulong __n;
  uint uVar8;
  undefined1 local_70 [24];
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  ushort local_38;
  
  __n = CONCAT62(in_register_00000032,index) & 0xffffffff;
  if ((ulong)((long)(this->_file).functions.
                    super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->_file).functions.
                    super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
                    super__Vector_impl_data._M_start >> 5) <= __n) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = &PTR__exception_00123c30;
    __cxa_throw(puVar6,&InvalidControlTransfer::typeinfo,std::exception::~exception);
  }
  pvVar3 = std::vector<vm::Function,_std::allocator<vm::Function>_>::at
                     (&(this->_file).functions,__n);
  local_58._M_p = (pointer)&local_48;
  local_50 = 0;
  local_48._M_local_buf[0] = '\0';
  local_70._20_4_ = (uint)index;
  pvVar4 = std::vector<vm::Constant,_std::allocator<vm::Constant>_>::at
                     (&(this->_file).constants,(ulong)pvVar3->nameIndex);
  std::get<0ul,std::__cxx11::string,int,double>(&pvVar4->value);
  std::__cxx11::string::_M_assign((string *)&local_58);
  local_38 = pvVar3->level;
  this_00 = &this->_contexts;
  pCVar2 = (this->_contexts).super__Vector_base<vm::VM::Context,_std::allocator<vm::VM::Context>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar1 = pCVar2[-1].functionLevel;
  uVar8 = (uint)uVar1;
  uVar7 = (uint)local_38;
  if (uVar1 + 1 == uVar7) {
    local_70._16_4_ =
         (int)((ulong)((long)pCVar2 -
                      (long)(this_00->
                            super__Vector_base<vm::VM::Context,_std::allocator<vm::VM::Context>_>).
                            _M_impl.super__Vector_impl_data._M_start) >> 6) + -1;
  }
  else {
    if (uVar1 < local_38) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = &PTR__exception_00123c30;
      __cxa_throw(puVar6,&InvalidControlTransfer::typeinfo,std::exception::~exception);
    }
    pvVar5 = pCVar2 + -1;
    for (; local_70._16_4_ = pvVar5->staticLink, (int)uVar7 < (int)uVar8; uVar8 = uVar8 - 1) {
      pvVar5 = std::vector<vm::VM::Context,_std::allocator<vm::VM::Context>_>::at
                         (this_00,(long)(int)local_70._16_4_);
    }
  }
  local_70._8_4_ = this->_bp;
  local_70._0_4_ = this->_ip;
  ensureStackUsed(this,(uint)pvVar3->paramSize);
  local_70._4_4_ = this->_sp - (uint)pvVar3->paramSize;
  this->_bp = local_70._4_4_;
  local_70._12_4_ = local_70._4_4_;
  std::vector<vm::VM::Context,_std::allocator<vm::VM::Context>_>::push_back
            (this_00,(value_type *)local_70);
  this->_ip = -1;
  std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::operator=
            (&this->_currentInstructions,&pvVar3->instructions);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void VM::CALL(u2 index) {
    if (0 > index || index >= this->_file.functions.size()) {
        throw InvalidControlTransfer();
    }
    Function& calledFunction = this->_file.functions.at(index);
    Context newContext;
    newContext.functionIndex = index;
    newContext.functionName = std::get<str_t>(this->_file.constants.at(calledFunction.nameIndex).value);

    newContext.functionLevel = calledFunction.level;
    int newLv = newContext.functionLevel;
    int curLv = _contexts.back().functionLevel;
    if (newLv == curLv + 1) {
        newContext.staticLink = _contexts.size()-1;
    }
    else if (newLv <= curLv) {
        int staticLink = _contexts.back().staticLink;
        for (; curLv > newLv; --curLv) {
            staticLink = _contexts.at(staticLink).staticLink;
        }
        newContext.staticLink = staticLink;
    }
    else {
        throw InvalidControlTransfer();
    }
    newContext.prevBP = this->_bp;
    newContext.prevPC = this->_ip;
    ensureStackUsed(calledFunction.paramSize);
    this->_bp = this->_sp - calledFunction.paramSize;
    newContext.prevSP = this->_bp;
    newContext.BP = this->_bp;
    _contexts.push_back(newContext);
    this->_ip = -1;
    this->_currentInstructions = calledFunction.instructions;
}